

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

void __thiscall
nv::FloatImage::applyKernelVertical
          (FloatImage *this,PolyphaseKernel *k,int x,uint c,uint a,WrapMode wm,float *output)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  char *pcVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float w;
  int idx;
  int j;
  float sum;
  float norm;
  int right;
  int left;
  float center;
  uint i;
  float *alpha;
  float *channel;
  int windowSize;
  float width;
  float iscale;
  float scale;
  uint length;
  WrapMode wm_local;
  uint a_local;
  uint c_local;
  int x_local;
  PolyphaseKernel *k_local;
  FloatImage *this_local;
  
  uVar2 = PolyphaseKernel::length(k);
  uVar1 = this->m_height;
  fVar8 = PolyphaseKernel::width(k);
  iVar3 = PolyphaseKernel::windowSize(k);
  pfVar5 = FloatImage::channel(this,c);
  pfVar6 = FloatImage::channel(this,a);
  for (left = 0; (uint)left < uVar2; left = left + 1) {
    fVar9 = ((float)(uint)left + 0.5) * (1.0 / ((float)uVar2 / (float)uVar1));
    fVar10 = floorf(fVar9 - fVar8);
    fVar9 = ceilf(fVar9 + fVar8);
    if ((iVar3 < (int)fVar9 - (int)fVar10) &&
       (iVar4 = nvAbort("right - left <= windowSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                        ,0x348,
                        "void nv::FloatImage::applyKernelVertical(const PolyphaseKernel &, int, uint, uint, WrapMode, float *__restrict) const"
                       ), iVar4 == 1)) {
      raise(5);
    }
    j = 0;
    idx = 0;
    for (w = 0.0; (int)w < iVar3; w = (float)((int)w + 1)) {
      pcVar7 = index(this,(char *)(ulong)(uint)x,(int)w + (int)fVar10);
      fVar9 = PolyphaseKernel::valueAt(k,left,(uint)w);
      fVar9 = fVar9 * (pfVar6[(int)pcVar7] + 0.00390625);
      j = (int)(fVar9 + (float)j);
      idx = (int)(fVar9 * pfVar5[(int)pcVar7] + (float)idx);
    }
    output[(uint)left] = (float)idx / (float)j;
  }
  return;
}

Assistant:

void FloatImage::applyKernelVertical(const PolyphaseKernel & k, int x, uint c, uint a, WrapMode wm, float * __restrict output) const
{
	const uint length = k.length();
	const float scale = float(length) / float(m_height);
	const float iscale = 1.0f / scale;

	const float width = k.width();
	const int windowSize = k.windowSize();

	const float * channel = this->channel(c);
	const float * alpha = this->channel(a);

	for (uint i = 0; i < length; i++)
	{
		const float center = (0.5f + i) * iscale;
		
		const int left = (int)floorf(center - width);
		const int right = (int)ceilf(center + width);
		nvCheck(right - left <= windowSize);
		
		float norm = 0;
		float sum = 0;
		for (int j = 0; j < windowSize; ++j)
		{
			const int idx = this->index(x, j+left, wm);
			
			float w = k.valueAt(i, j) * (alpha[idx] + (1.0f / 256.0f));
			norm += w;
			sum += w * channel[idx];
		}
		
		output[i] = sum / norm;
	}
}